

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportConfig
          (cmExportFileGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  ulong uVar1;
  string local_80;
  allocator<char> local_49;
  string local_48 [8];
  string suffix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  string *config_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  suffix.field_2._8_8_ = missingTargets;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"_",&local_49);
  std::allocator<char>::~allocator(&local_49);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_80,config);
    std::__cxx11::string::operator+=(local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::operator+=(local_48,"NOCONFIG");
  }
  (*this->_vptr_cmExportFileGenerator[0xd])(this,os,config,local_48,suffix.field_2._8_8_);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportConfig(
  std::ostream& os, const std::string& config,
  std::vector<std::string>& missingTargets)
{
  // Construct the property configuration suffix.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // Generate the per-config target information.
  this->GenerateImportTargetsConfig(os, config, suffix, missingTargets);
}